

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

char * __thiscall kj::Vector<char>::add<char32_t&>(Vector<char> *this,char32_t *params)

{
  bool bVar1;
  char32_t *params_00;
  char *pcVar2;
  char32_t *params_local;
  Vector<char> *this_local;
  
  bVar1 = ArrayBuilder<char>::isFull(&this->builder);
  if (bVar1) {
    grow(this,0);
  }
  params_00 = fwd<char32_t&>(params);
  pcVar2 = ArrayBuilder<char>::add<char32_t&>(&this->builder,params_00);
  return pcVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }